

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::EnumNameMember
          (GoGenerator *this,EnumDef *enum_def,EnumVal *ev,size_t max_name_length,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_50;
  
  std::__cxx11::string::append((char *)code_ptr);
  IdlNamer::EnumVariant_abi_cxx11_(&local_50,&this->namer_,enum_def,ev);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct
            ((ulong)&local_50,(char)max_name_length - (char)(ev->name)._M_string_length);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)(ev->name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void EnumNameMember(const EnumDef &enum_def, const EnumVal &ev,
                      size_t max_name_length, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\t";
    code += namer_.EnumVariant(enum_def, ev);
    code += ": ";
    code += std::string(max_name_length - ev.name.length(), ' ');
    code += "\"";
    code += ev.name;
    code += "\",\n";
  }